

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.cpp
# Opt level: O0

bool __thiscall TPZSavable::Compare(TPZSavable *this,TPZSavable *copy,bool override)

{
  int iVar1;
  ostream *poVar2;
  byte in_DL;
  long *in_RDI;
  stringstream sout;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [383];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"Class id ");
  iVar1 = (**(code **)(*in_RDI + 0x20))();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," Compare needs to be implemented");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_1d0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return false;
}

Assistant:

bool TPZSavable::Compare(TPZSavable *copy, bool override) const
{
	std::stringstream sout;
	sout << "Class id " << ClassId() << " Compare needs to be implemented";
	LOGPZ_ERROR(loggerCheck,sout.str())
	return false;
}